

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O2

TlvPtr ot::commissioner::tlv::Tlv::Deserialize
                 (Error *aError,size_t *aOffset,ByteArray *aBuf,Scope aScope)

{
  char cVar1;
  pointer puVar2;
  long lVar3;
  pointer puVar4;
  char *pcVar5;
  undefined7 in_register_00000009;
  long *plVar6;
  char *pcVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar8;
  type atVar9 [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer puVar10;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  TlvPtr TVar11;
  Scope aScope_local;
  writer write;
  string local_f0;
  Error error;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_58 [40];
  
  plVar6 = (long *)CONCAT71(in_register_00000009,aScope);
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  puVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined8 *)aError = 0;
  (aError->mMessage)._M_dataplus._M_p = (pointer)0x0;
  puVar10 = puVar2 + 2;
  lVar3 = *plVar6;
  puVar4 = (pointer)(plVar6[1] - lVar3);
  if (puVar4 < puVar10) {
    local_98.types_ = (type  [2])((ulong)local_98.types_[1] << 0x20);
    local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of TLV";
    local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x14;
    local_98.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_98.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_98.parse_funcs_[0] = (parse_func)0x0;
    pcVar5 = "premature end of TLV";
    local_98.context_.types_ = local_98.types_;
    while (pcVar7 = pcVar5, pcVar7 != "") {
      pcVar5 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)&local_98);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_98;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f0,(v10 *)"premature end of TLV",(string_view)ZEXT816(0x14),args);
    local_58._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_f0);
    Error::operator=(&error,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_f0);
    puVar10 = puVar2;
  }
  else {
    atVar9._1_7_ = 0;
    atVar9[0]._0_1_ = puVar2[lVar3];
    uVar8 = (ulong)puVar2[lVar3 + 1];
    if (uVar8 == 0xff) {
      if (puVar4 < puVar2 + 4) {
        local_98.types_[0] = uint_type;
        local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "premature end of Extended TLV(type={})";
        local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
        local_98.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_98.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_98.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        pcVar5 = "premature end of Extended TLV(type={})";
        write.handler_ = &local_98;
        local_98.context_.types_ = local_98.types_;
        while (pcVar5 != "") {
          cVar1 = *pcVar5;
          pcVar7 = pcVar5;
          while (cVar1 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
              ::writer::operator()((writer *)&write,pcVar5,"");
              goto LAB_00195def;
            }
            cVar1 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
          ::writer::operator()((writer *)&write,pcVar5,pcVar7);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                             (pcVar7,"",(format_string_checker<char> *)&local_98);
        }
LAB_00195def:
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0x26;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)&local_98;
        local_98.types_ = atVar9;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_f0,(v10 *)"premature end of Extended TLV(type={})",fmt_00,args_01);
        local_58._0_4_ = kBadFormat;
        std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_f0);
        Error::operator=(&error,(Error *)local_58);
        std::__cxx11::string::~string((string *)(local_58 + 8));
        std::__cxx11::string::~string((string *)&local_f0);
        goto LAB_00195e5b;
      }
      uVar8 = (ulong)(ushort)(*(ushort *)(puVar2 + lVar3 + 2) << 8 |
                             *(ushort *)(puVar2 + lVar3 + 2) >> 8);
      puVar10 = puVar2 + 4;
    }
    if (puVar4 < puVar10 + uVar8) {
      local_98.types_[0] = uint_type;
      local_98.types_[1] = uint_type;
      local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of TLV(type={}, length={})";
      local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x28;
      local_98.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_98.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_98.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
      local_98.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
      pcVar5 = "premature end of TLV(type={}, length={})";
      write.handler_ = &local_98;
      local_98.context_.types_ = local_98.types_;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_unsigned_short>_>
            ::writer::operator()(&write,pcVar5,"");
            goto LAB_00195d6e;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_unsigned_short>_>
        ::writer::operator()(&write,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char,unsigned_short>&>
                           (pcVar7,"",&local_98);
      }
LAB_00195d6e:
      fmt.size_ = 0x22;
      fmt.data_ = (char *)0x28;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_98;
      local_98.types_ = atVar9;
      local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = uVar8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_f0,(v10 *)"premature end of TLV(type={}, length={})",fmt,args_00);
      local_58._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_f0);
      Error::operator=(&error,(Error *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      local_58[0] = puVar2[lVar3];
      std::
      make_shared<ot::commissioner::tlv::Tlv,ot::commissioner::tlv::Type,ot::commissioner::tlv::Scope&>
                ((Type *)&local_98,local_58);
      std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)aError,
                 (__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.context_);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)(*(long *)aError + 8),
                 puVar10 + *plVar6,puVar10 + *plVar6 + uVar8);
      puVar10 = puVar10 + uVar8;
    }
  }
LAB_00195e5b:
  if (error.mCode == kNone) {
    (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = puVar10;
  }
  else {
    local_98.types_[0] = none_type;
    local_98.types_[1] = none_type;
    local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ = (char *)0x0;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)aError,
               (__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.context_);
  }
  Error::operator=((Error *)aOffset,&error);
  std::__cxx11::string::~string((string *)&error.mMessage);
  TVar11.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  TVar11.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)aError;
  return (TlvPtr)TVar11.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TlvPtr Tlv::Deserialize(Error &aError, size_t &aOffset, const ByteArray &aBuf, Scope aScope)
{
    Error    error;
    size_t   offset = aOffset;
    uint8_t  type;
    uint16_t length;
    TlvPtr   tlv = nullptr;

    VerifyOrExit(offset + 2 <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of TLV"));
    type   = aBuf[offset++];
    length = aBuf[offset++];
    if (length == kEscapeLength)
    {
        VerifyOrExit(offset + 2 <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of Extended TLV(type={})", type));

        length = (aBuf[offset++] << 8) & 0xFF00;
        length |= (aBuf[offset++]) & 0x00FF;
    }

    VerifyOrExit(offset + length <= aBuf.size(),
                 error = ERROR_BAD_FORMAT("premature end of TLV(type={}, length={})", type, length));

    tlv = std::make_shared<Tlv>(utils::from_underlying<Type>(type), aScope);
    tlv->SetValue(&aBuf[offset], length);

    offset += length;

exit:
    if (error != ErrorCode::kNone)
    {
        tlv = nullptr;
    }
    else
    {
        aOffset = offset;
    }

    aError = error;
    return tlv;
}